

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lvm.c
# Opt level: O0

int l_strcmp(TString *ts1,TString *ts2)

{
  int iVar1;
  char *pcVar2;
  TString *pTVar3;
  undefined1 *puVar4;
  TString *local_68;
  TString *local_60;
  size_t zl2;
  size_t zl1;
  TString *pTStack_40;
  int temp;
  size_t rl2;
  char *s2;
  size_t rl1;
  char *s1;
  TString *ts2_local;
  TString *ts1_local;
  
  rl1 = (size_t)ts1->contents;
  if (ts1->shrlen == 0xff) {
    local_60 = (ts1->u).hnext;
  }
  else {
    local_60 = (TString *)(ulong)ts1->shrlen;
  }
  s2 = (char *)local_60;
  rl2 = (size_t)ts2->contents;
  if (ts2->shrlen == 0xff) {
    local_68 = (ts2->u).hnext;
  }
  else {
    local_68 = (TString *)(ulong)ts2->shrlen;
  }
  pTStack_40 = local_68;
  while( true ) {
    iVar1 = strcoll((char *)rl1,(char *)rl2);
    if (iVar1 != 0) {
      return iVar1;
    }
    pcVar2 = (char *)strlen((char *)rl1);
    pTVar3 = (TString *)strlen((char *)rl2);
    if (pTVar3 == pTStack_40) break;
    if (pcVar2 == s2) {
      return -1;
    }
    puVar4 = (undefined1 *)((long)&pTVar3->next + 1);
    rl1 = (size_t)(pcVar2 + 1 + rl1);
    s2 = s2 + -(long)(pcVar2 + 1);
    rl2 = (size_t)(puVar4 + rl2);
    pTStack_40 = (TString *)((long)pTStack_40 - (long)puVar4);
  }
  return (uint)(pcVar2 != s2);
}

Assistant:

static int l_strcmp (const TString *ts1, const TString *ts2) {
  const char *s1 = getstr(ts1);
  size_t rl1 = tsslen(ts1);  /* real length */
  const char *s2 = getstr(ts2);
  size_t rl2 = tsslen(ts2);
  for (;;) {  /* for each segment */
    int temp = strcoll(s1, s2);
    if (temp != 0)  /* not equal? */
      return temp;  /* done */
    else {  /* strings are equal up to a '\0' */
      size_t zl1 = strlen(s1);  /* index of first '\0' in 's1' */
      size_t zl2 = strlen(s2);  /* index of first '\0' in 's2' */
      if (zl2 == rl2)  /* 's2' is finished? */
        return (zl1 == rl1) ? 0 : 1;  /* check 's1' */
      else if (zl1 == rl1)  /* 's1' is finished? */
        return -1;  /* 's1' is less than 's2' ('s2' is not finished) */
      /* both strings longer than 'zl'; go on comparing after the '\0' */
      zl1++; zl2++;
      s1 += zl1; rl1 -= zl1; s2 += zl2; rl2 -= zl2;
    }
  }
}